

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptExternalFunction.cpp
# Opt level: O0

Var Js::JavascriptExternalFunction::ExternalFunctionThunk
              (RecyclableObject *function,CallInfo callInfo,...)

{
  code *pcVar1;
  bool bVar2;
  int n;
  Var *values;
  undefined4 *puVar3;
  Type *this;
  ScriptContext *this_00;
  ThreadContext *pTVar4;
  JavascriptLibrary *this_01;
  undefined1 local_98 [8];
  AutoReentrancyHandler autoReentrancyHandler;
  LeaveScriptObject<true,_true,_false> __leaveScriptObject;
  void *__frameAddr;
  Var result;
  ScriptContext *scriptContext;
  JavascriptExternalFunction *externalFunction;
  ArgumentReader args;
  Var *_argsVarArray;
  RecyclableObject *function_local;
  CallInfo callInfo_local;
  
  function_local = (RecyclableObject *)callInfo;
  n = _count_args(callInfo);
  values = _get_va(&stack0x00000000,n);
  args.super_Arguments.Values = (Type)function_local;
  bVar2 = CallInfo::operator==((CallInfo *)(values + -1),(CallInfo)function_local);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptExternalFunction.cpp"
                                ,0xbe,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)&externalFunction,(CallInfo *)&function_local,values);
  this = Memory::WriteBarrierPtr<Js::Type>::operator->(&function->type);
  this_00 = Js::Type::GetScriptContext(this);
  PrepareExternalCall((JavascriptExternalFunction *)function,(Arguments *)&externalFunction);
  bVar2 = ScriptContext::ShouldPerformRecordOrReplayAction(this_00);
  if (bVar2) {
    __frameAddr = HandleRecordReplayExternalFunction_Thunk
                            ((JavascriptFunction *)function,(CallInfo *)&function_local,
                             (Arguments *)&externalFunction,this_00);
  }
  else {
    LeaveScriptObject<true,_true,_false>::LeaveScriptObject
              ((LeaveScriptObject<true,_true,_false> *)
               &autoReentrancyHandler.m_savedReentrancySafeOrHandled,this_00,&callInfo_local);
    pTVar4 = ScriptContext::GetThreadContext(this_00);
    AutoReentrancyHandler::AutoReentrancyHandler((AutoReentrancyHandler *)local_98,pTVar4);
    __frameAddr = (void *)(*(code *)function[5].type.ptr)
                                    (function,function_local,args.super_Arguments.Info);
    bVar2 = ScriptContext::HasRecordedException(this_00);
    if (bVar2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptExternalFunction.cpp"
                                  ,0xd7,"(!scriptContext->HasRecordedException())",
                                  "!scriptContext->HasRecordedException()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
    if (this_00 != (ScriptContext *)0x0) {
      pTVar4 = ScriptContext::GetThreadContext(this_00);
      ThreadContext::DisposeOnLeaveScript(pTVar4);
    }
    AutoReentrancyHandler::~AutoReentrancyHandler((AutoReentrancyHandler *)local_98);
    LeaveScriptObject<true,_true,_false>::~LeaveScriptObject
              ((LeaveScriptObject<true,_true,_false> *)
               &autoReentrancyHandler.m_savedReentrancySafeOrHandled);
  }
  if (__frameAddr == (void *)0x0) {
    this_01 = ScriptContext::GetLibrary(this_00);
    __frameAddr = JavascriptLibraryBase::GetUndefined(&this_01->super_JavascriptLibraryBase);
  }
  else {
    __frameAddr = CrossSite::MarshalVar(this_00,__frameAddr,false);
  }
  return __frameAddr;
}

Assistant:

Var JavascriptExternalFunction::ExternalFunctionThunk(RecyclableObject* function, CallInfo callInfo, ...)
    {
        ARGUMENTS(args, callInfo);
        JavascriptExternalFunction* externalFunction = static_cast<JavascriptExternalFunction*>(function);

        ScriptContext * scriptContext = externalFunction->type->GetScriptContext();

#ifdef ENABLE_DIRECTCALL_TELEMETRY
        DirectCallTelemetry::AutoLogger logger(scriptContext, externalFunction, &args);
#endif

        externalFunction->PrepareExternalCall(&args);

#if ENABLE_TTD
        Var result = nullptr;

        if(scriptContext->ShouldPerformRecordOrReplayAction())
        {
            result = JavascriptExternalFunction::HandleRecordReplayExternalFunction_Thunk(externalFunction, callInfo, args, scriptContext);
        }
        else
        {
            BEGIN_LEAVE_SCRIPT_WITH_EXCEPTION(scriptContext)
            {
                // Don't do stack probe since BEGIN_LEAVE_SCRIPT_WITH_EXCEPTION does that for us already
                result = externalFunction->nativeMethod(function, callInfo, args.Values);
            }
            END_LEAVE_SCRIPT_WITH_EXCEPTION(scriptContext);
        }
#else
        Var result = nullptr;
        BEGIN_LEAVE_SCRIPT_WITH_EXCEPTION(scriptContext)
        {
            // Don't do stack probe since BEGIN_LEAVE_SCRIPT_WITH_EXCEPTION does that for us already
            result = externalFunction->nativeMethod(function, callInfo, args.Values);
        }
        END_LEAVE_SCRIPT_WITH_EXCEPTION(scriptContext);
#endif

        if (result == nullptr)
        {
#pragma warning(push)
#pragma warning(disable:6011) // scriptContext cannot be null here
            result = scriptContext->GetLibrary()->GetUndefined();
#pragma warning(pop)
        }
        else
        {
            result = CrossSite::MarshalVar(scriptContext, result);
        }

        return result;
    }